

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O1

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,string *hex)

{
  pointer puVar1;
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  unsigned_long local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_0068e010;
  ByteData::ByteData(&this->data_);
  StringUtil::StringToByte(&local_58,(string *)hex);
  local_30.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,&local_30,&local_38,
             (allocator_type *)local_98);
  local_40 = (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (local_40 == 0x20) {
    ByteData::ByteData((ByteData *)local_98,&local_70);
    puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_88._M_allocated_capacity;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_88._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if ((pointer)local_98._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_98._0_8_);
    }
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_98._0_8_ = "cfdcore_coin.cpp";
  local_98._8_4_ = 0x4f;
  local_88._M_allocated_capacity = 0x4e374a;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"BlockHash size Invalid. size={}.",
             &local_40);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = &local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"BlockHash size Invalid.","")
  ;
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlockHash::BlockHash(const std::string& hex) : data_() {
  const std::vector<uint8_t>& data = StringUtil::StringToByte(hex);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  if (reverse_buffer.size() != kByteData256Length) {
    warn(
        CFD_LOG_SOURCE, "BlockHash size Invalid. size={}.",
        reverse_buffer.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "BlockHash size Invalid.");
  }
  data_ = ByteData(reverse_buffer);
}